

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_3::Map::GenerateAggregateInitializer
          (Map *this,Printer *p)

{
  undefined8 uVar1;
  char *pcVar2;
  
  if ((this->super_FieldGeneratorBase).should_split_ == true) {
    pcVar2 = 
    "\n        /* decltype($Msg$::Split::$name$_) */ {\n            $pbi$::ArenaInitialized(),\n            arena,\n        },\n      "
    ;
    uVar1 = 0x7c;
  }
  else {
    pcVar2 = "\n        /* decltype($field_$) */ {$pbi$::ArenaInitialized(), arena},\n      ";
    uVar1 = 0x4c;
  }
  google::protobuf::io::Printer::Emit(p,0,0,uVar1,pcVar2);
  return;
}

Assistant:

void GenerateAggregateInitializer(io::Printer* p) const override {
    if (should_split()) {
      p->Emit(R"cc(
        /* decltype($Msg$::Split::$name$_) */ {
            $pbi$::ArenaInitialized(),
            arena,
        },
      )cc");
    } else {
      p->Emit(R"cc(
        /* decltype($field_$) */ {$pbi$::ArenaInitialized(), arena},
      )cc");
    }
  }